

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# temporary_file_manager.cpp
# Opt level: O1

TemporaryFileIndex * __thiscall
duckdb::TemporaryFileHandle::TryGetBlockIndex
          (TemporaryFileIndex *__return_storage_ptr__,TemporaryFileHandle *this)

{
  mutex *mutex;
  TemporaryFileLock lock;
  idx_t index;
  lock_guard<std::mutex> local_20;
  idx_t local_18;
  
  mutex = &this->file_lock;
  TemporaryFileLock::TemporaryFileLock((TemporaryFileLock *)&local_20,mutex);
  if (((this->index_manager).max_index < this->max_allowed_index) ||
     ((this->index_manager).free_indexes._M_t._M_impl.super__Rb_tree_header._M_node_count == 0)) {
    CreateFileIfNotExists(this,(TemporaryFileLock *)mutex);
    local_18 = BlockIndexManager::GetNewBlockIndexInternal
                         (&this->index_manager,(this->identifier).size);
    ::std::
    _Rb_tree<unsigned_long,unsigned_long,std::_Identity<unsigned_long>,std::less<unsigned_long>,std::allocator<unsigned_long>>
    ::_M_insert_unique<unsigned_long_const&>
              ((_Rb_tree<unsigned_long,unsigned_long,std::_Identity<unsigned_long>,std::less<unsigned_long>,std::allocator<unsigned_long>>
                *)&(this->index_manager).indexes_in_use,&local_18);
    TemporaryFileIndex::TemporaryFileIndex(__return_storage_ptr__,this->identifier,local_18);
  }
  else {
    TemporaryFileIndex::TemporaryFileIndex(__return_storage_ptr__);
  }
  pthread_mutex_unlock((pthread_mutex_t *)local_20._M_device);
  return __return_storage_ptr__;
}

Assistant:

TemporaryFileIndex TemporaryFileHandle::TryGetBlockIndex() {
	TemporaryFileLock lock(file_lock);
	if (index_manager.GetMaxIndex() >= max_allowed_index && index_manager.HasFreeBlocks()) {
		// file is at capacity
		return TemporaryFileIndex();
	}
	// open the file handle if it does not yet exist
	CreateFileIfNotExists(lock);
	// fetch a new block index to write to
	auto block_index = index_manager.GetNewBlockIndex(identifier.size);
	return TemporaryFileIndex(identifier, block_index);
}